

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd-tree.cpp
# Opt level: O0

void exchange_bounds(void *b_,ReduceProxy *srp)

{
  int extraout_EAX;
  int iVar1;
  uint uVar2;
  int iVar3;
  Master *this;
  undefined4 extraout_var;
  Proxy *this_00;
  char *__to;
  ReduceProxy *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  int i_1;
  RCLink *link;
  int i;
  Block *b;
  Link *in_stack_fffffffffffffee8;
  Bounds<float> *in_stack_fffffffffffffef0;
  ReduceProxy *x;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  Master *in_stack_ffffffffffffff00;
  value_type *__x;
  size_type in_stack_ffffffffffffff18;
  vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_> *in_stack_ffffffffffffff20;
  int local_c0;
  value_type local_b0;
  BlockID local_30;
  RegularLink<diy::Bounds<float>_> *local_28;
  int local_1c;
  long local_18;
  ReduceProxy *local_10;
  
  local_18 = in_RDI;
  local_10 = in_RSI;
  diy::ReduceProxy::round(in_RSI,in_XMM0_Qa);
  if (extraout_EAX == 0) {
    local_1c = 0;
    while( true ) {
      iVar3 = local_1c;
      diy::ReduceProxy::out_link(local_10);
      iVar1 = diy::Link::size((Link *)0x14e938);
      if (iVar1 <= iVar3) break;
      this = diy::Master::Proxy::master(&local_10->super_Proxy);
      diy::Master::Proxy::master(&local_10->super_Proxy);
      diy::Master::Proxy::gid(&local_10->super_Proxy);
      uVar2 = diy::Master::lid(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      iVar3 = diy::Master::link(this,(char *)(ulong)uVar2,__to);
      local_28 = (RegularLink<diy::Bounds<float>_> *)CONCAT44(extraout_var,iVar3);
      diy::ReduceProxy::out_link(local_10);
      local_30 = diy::Link::target(in_stack_fffffffffffffee8,0);
      diy::RegularLink<diy::Bounds<float>_>::bounds(local_28);
      diy::Master::Proxy::enqueue<diy::Bounds<float>>
                ((Proxy *)in_stack_ffffffffffffff00,
                 (BlockID *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                 in_stack_fffffffffffffef0,
                 (_func_void_BinaryBuffer_ptr_Bounds<float>_ptr *)in_stack_fffffffffffffee8);
      local_1c = local_1c + 1;
    }
  }
  else {
    this_00 = (Proxy *)(local_18 + 0x98);
    diy::ReduceProxy::in_link(local_10);
    diy::Link::size((Link *)0x14ea34);
    __x = &local_b0;
    diy::Bounds<float>::Bounds((Bounds<float> *)this_00,in_stack_fffffffffffffefc);
    Catch::clara::std::vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_>::resize
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,__x);
    diy::Bounds<float>::~Bounds(in_stack_fffffffffffffef0);
    local_c0 = 0;
    while( true ) {
      iVar3 = local_c0;
      diy::ReduceProxy::in_link(local_10);
      iVar1 = diy::Link::size((Link *)0x14ea91);
      if (iVar1 <= iVar3) break;
      x = local_10;
      diy::ReduceProxy::in_link(local_10);
      diy::Link::target(in_stack_fffffffffffffee8,0);
      Catch::clara::std::vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_>::
      operator[]((vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_> *)
                 (local_18 + 0x98),(long)local_c0);
      diy::Master::Proxy::dequeue<diy::Bounds<float>>
                (this_00,iVar3,(Bounds<float> *)x,
                 (_func_void_BinaryBuffer_ptr_Bounds<float>_ptr *)in_stack_fffffffffffffee8);
      local_c0 = local_c0 + 1;
    }
  }
  return;
}

Assistant:

void exchange_bounds(void* b_, const diy::ReduceProxy& srp)
{
  Block*   b   = static_cast<Block*>(b_);

  if (srp.round() == 0)
      for (int i = 0; i < srp.out_link().size(); ++i)
      {
          RCLink* link = static_cast<RCLink*>(srp.master()->link(srp.master()->lid(srp.gid())));
          srp.enqueue(srp.out_link().target(i), link->bounds());
      }
  else
  {
      b->block_bounds.resize(srp.in_link().size(), 0);
      for (int i = 0; i < srp.in_link().size(); ++i)
      {
        assert(i == srp.in_link().target(i).gid);
        srp.dequeue(srp.in_link().target(i).gid, b->block_bounds[i]);
      }
  }
}